

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tigger_gen.cpp
# Opt level: O2

shared_ptr<tg_program> tigger_gen(shared_ptr<ee_program> *eeprog)

{
  char *pcVar1;
  ee_funcdef *peVar2;
  element_type *peVar3;
  mapped_type *pmVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  ee_funcdef *eef;
  char *pcVar5;
  shared_ptr<tg_program> sVar6;
  unordered_map<int,_std::optional<int>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::optional<int>_>_>_>
  global_decl_map;
  _Hashtable<int,_std::pair<const_int,_std::optional<int>_>,_std::allocator<std::pair<const_int,_std::optional<int>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a8;
  tg_funcdef local_70;
  
  std::make_shared<tg_program>();
  local_a8._M_buckets = &local_a8._M_single_bucket;
  local_a8._M_bucket_count = 1;
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  pcVar5 = *(char **)*in_RSI;
  pcVar1 = (char *)((undefined8 *)*in_RSI)[1];
  while( true ) {
    if (pcVar5 == pcVar1) {
      peVar2 = *(ee_funcdef **)(*in_RSI + 0x20);
      for (eef = *(ee_funcdef **)(*in_RSI + 0x18); eef != peVar2; eef = eef + 1) {
        peVar3 = (eeprog->super___shared_ptr<ee_program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        tigger_func_gen(&local_70,eef,
                        (unordered_map<int,_std::optional<int>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::optional<int>_>_>_>
                         *)&local_a8);
        std::vector<tg_funcdef,_std::allocator<tg_funcdef>_>::emplace_back<tg_funcdef>
                  ((vector<tg_funcdef,_std::allocator<tg_funcdef>_> *)&peVar3->funcdefs,&local_70);
        tg_funcdef::~tg_funcdef(&local_70);
      }
      std::
      _Hashtable<int,_std::pair<const_int,_std::optional<int>_>,_std::allocator<std::pair<const_int,_std::optional<int>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_a8);
      sVar6.super___shared_ptr<tg_program,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar6.super___shared_ptr<tg_program,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)eeprog;
      return (shared_ptr<tg_program>)
             sVar6.super___shared_ptr<tg_program,_(__gnu_cxx::_Lock_policy)2>;
    }
    if (*pcVar5 != 'T') break;
    local_70.name._M_dataplus._M_p._0_4_ = *(undefined4 *)(pcVar5 + 4);
    local_70.name._4_8_ = *(undefined8 *)(pcVar5 + 8);
    std::vector<tg_global_decl,_std::allocator<tg_global_decl>_>::emplace_back<tg_global_decl>
              ((vector<tg_global_decl,_std::allocator<tg_global_decl>_> *)
               (eeprog->super___shared_ptr<ee_program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               (tg_global_decl *)&local_70);
    pmVar4 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::optional<int>_>,_std::allocator<std::pair<const_int,_std::optional<int>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::optional<int>_>,_std::allocator<std::pair<const_int,_std::optional<int>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_a8,(key_type *)(pcVar5 + 4));
    (pmVar4->super__Optional_base<int,_true,_true>)._M_payload.super__Optional_payload_base<int> =
         *(_Optional_payload_base<int> *)(pcVar5 + 8);
    pcVar5 = pcVar5 + 0x10;
  }
  __assert_fail("decl.sym.type == \'T\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gzz2000[P]Compiler101/tigger_gen.cpp"
                ,0x2b2,"std::shared_ptr<tg_program> tigger_gen(std::shared_ptr<ee_program>)");
}

Assistant:

std::shared_ptr<tg_program> tigger_gen(std::shared_ptr<ee_program> eeprog) {
  std::shared_ptr<tg_program> ret = std::make_shared<tg_program>();
  std::unordered_map<int, std::optional<int>> global_decl_map;
  // decl
  for(const auto &decl: eeprog->decls) {
    assert(decl.sym.type == 'T');
    ret->decls.push_back(tg_global_decl{decl.sym.id, decl.size});
    global_decl_map[decl.sym.id] = decl.size;
  }
  // funcdefs
  for(const auto &funcdef: eeprog->funcdefs) {
    ret->funcdefs.push_back(tigger_func_gen(funcdef, global_decl_map));
  }
  return ret;
}